

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cc
# Opt level: O2

void anon_unknown.dwarf_56160::replace(string *str,string *find,string *replace)

{
  ulong uVar1;
  
  while( true ) {
    uVar1 = std::__cxx11::string::find((string *)str,(ulong)find);
    if (uVar1 == 0xffffffffffffffff) break;
    std::__cxx11::string::replace((ulong)str,uVar1,(string *)find->_M_string_length);
  }
  return;
}

Assistant:

void replace(
    std::string& str,
    const std::string& find,
    const std::string& replace) {
  std::string::size_type pos = 0u;
  while ((pos = str.find(find, pos)) != std::string::npos) {
    str.replace(pos, find.length(), replace);
    pos += replace.length();
  }
}